

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O2

int run_helper_tcp6_echo_server(void)

{
  int iVar1;
  char *__ptr;
  size_t sStack_30;
  sockaddr_in6 local_24;
  
  loop = uv_default_loop();
  iVar1 = uv_ip6_addr("::1",0x23a3,&local_24);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/echo-server.c"
            ,0x121,"0 == uv_ip6_addr(\"::1\", port, &addr6)");
    abort();
  }
  server = (uv_handle_t *)&tcpServer;
  serverType = TCP;
  iVar1 = uv_tcp_init(loop,&tcpServer);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_bind(&tcpServer,(sockaddr *)&local_24,0);
    if (iVar1 == 0) {
      iVar1 = uv_listen((uv_stream_t *)&tcpServer,0x1000,on_connection);
      if (iVar1 != 0) {
        __ptr = "Listen error\n";
        sStack_30 = 0xd;
        goto LAB_0010d1d3;
      }
    }
    else {
      fwrite("IPv6 not supported\n",0x13,1,_stderr);
    }
    notify_parent_process();
    iVar1 = 0;
    uv_run(loop,UV_RUN_DEFAULT);
  }
  else {
    __ptr = "Socket creation error\n";
    sStack_30 = 0x16;
LAB_0010d1d3:
    fwrite(__ptr,sStack_30,1,_stderr);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

HELPER_IMPL(tcp6_echo_server) {
  loop = uv_default_loop();

  if (tcp6_echo_start(TEST_PORT))
    return 1;

  notify_parent_process();
  uv_run(loop, UV_RUN_DEFAULT);
  return 0;
}